

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# left_objects_detector.cpp
# Opt level: O0

void __thiscall
feintrack::SimpleLeftObjectsDetector::DelFromShadyLeftObjects
          (SimpleLeftObjectsDetector *this,uint obj_uid)

{
  bool bVar1;
  pointer pCVar2;
  const_iterator local_38 [2];
  _Self local_28;
  _Self local_20;
  iterator iter;
  uint obj_uid_local;
  SimpleLeftObjectsDetector *this_local;
  
  iter._M_node._4_4_ = obj_uid;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>::
       begin(&this->shady_left_objects);
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>::
         end(&this->shady_left_objects);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) {
      return;
    }
    pCVar2 = std::_List_iterator<feintrack::CShadyLeftObj>::operator->(&local_20);
    if ((pCVar2->super_CLeftObjView).obj_uid == iter._M_node._4_4_) break;
    std::_List_iterator<feintrack::CShadyLeftObj>::operator++(&local_20);
  }
  std::_List_const_iterator<feintrack::CShadyLeftObj>::_List_const_iterator(local_38,&local_20);
  std::__cxx11::list<feintrack::CShadyLeftObj,_std::allocator<feintrack::CShadyLeftObj>_>::erase
            (&this->shady_left_objects,local_38[0]);
  return;
}

Assistant:

void SimpleLeftObjectsDetector::DelFromShadyLeftObjects(
        unsigned int obj_uid
        )
{
    for (auto iter = shady_left_objects.begin(); iter != shady_left_objects.end(); ++iter)
    {
        if (iter->obj_uid == obj_uid)
        {
            iter = shady_left_objects.erase(iter);
            return;
        }
    }
}